

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_block_read(BigBlock *bb,BigBlockPtr *ptr,BigArray *array)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  void *buf;
  FILE *__stream;
  int *piVar6;
  char *pcVar7;
  void *pvVar8;
  bool bVar9;
  int local_4cc;
  void *local_4c8;
  size_t chunk_size;
  ptrdiff_t abs;
  ptrdiff_t toread;
  FILE *fp;
  BigArrayIter array_iter;
  BigArrayIter chunk_iter;
  size_t dims [2];
  undefined1 local_260 [8];
  BigArray chunk_array;
  size_t CHUNK_SIZE;
  int felsize;
  int nmemb;
  char *chunkbuf;
  BigArray *array_local;
  BigBlockPtr *ptr_local;
  BigBlock *bb_local;
  
  buf = malloc(CHUNK_BYTES);
  if (bb->nmemb == 0) {
    local_4cc = 1;
  }
  else {
    local_4cc = bb->nmemb;
  }
  iVar4 = big_file_dtype_itemsize(bb->dtype);
  iVar4 = iVar4 * local_4cc;
  chunk_array.data = (void *)(CHUNK_BYTES / (ulong)(long)iVar4);
  memset(local_260,0,0x220);
  chunk_iter.dataptr = chunk_array.data;
  if (buf == (void *)0x0) {
    _big_file_raise("Not enough memory for chunkbuf",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x333);
  }
  else {
    big_array_init((BigArray *)local_260,buf,bb->dtype,2,(size_t *)&chunk_iter.dataptr,
                   (ptrdiff_t *)0x0);
    big_array_iter_init((BigArrayIter *)&fp,array);
    abs = array->size / (ulong)(long)local_4cc;
    if (bb->size < bb->foffset[ptr->fileid] + ptr->roffset + abs) {
      _big_file_raise("Reading beyond the block `%s` at (%d:%td)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x33e,bb->basename,(ulong)(uint)ptr->fileid,ptr->roffset * (long)iVar4);
    }
    else {
      do {
        bVar9 = false;
        if (0 < abs) {
          iVar5 = big_block_eof(bb,ptr);
          bVar9 = iVar5 == 0;
        }
        if (!bVar9) {
          free(buf);
          return 0;
        }
        local_4c8 = chunk_array.data;
        if ((void *)(bb->fsize[ptr->fileid] - ptr->roffset) < chunk_array.data) {
          local_4c8 = (void *)(bb->fsize[ptr->fileid] - ptr->roffset);
        }
        if ((ulong)abs < local_4c8) {
          local_4c8 = (void *)abs;
        }
        if (local_4c8 == (void *)0x0) {
          _big_file_raise("Insufficient number of items in file `%s\' at (%d:%td)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x34d,bb->basename,(ulong)(uint)ptr->fileid,ptr->roffset * (long)iVar4);
          goto LAB_001060c4;
        }
        big_array_iter_init((BigArrayIter *)&array_iter.dataptr,(BigArray *)local_260);
        __stream = (FILE *)_big_file_open_a_file(bb->basename,ptr->fileid,"r",1);
        if (__stream == (FILE *)0x0) {
          _big_file_raise((char *)0x0,
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x355);
          goto LAB_001060c4;
        }
        iVar5 = fseek(__stream,ptr->roffset * (long)iVar4,0);
        if (iVar5 < 0) {
          pcVar2 = bb->basename;
          uVar1 = ptr->fileid;
          lVar3 = ptr->roffset;
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          _big_file_raise("Failed to seek in block `%s\' at (%d:%td) (%s)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x359,pcVar2,(ulong)uVar1,lVar3 * iVar4,pcVar7);
LAB_001060b0:
          fclose(__stream);
          goto LAB_001060c4;
        }
        pvVar8 = (void *)fread(buf,(long)iVar4,(size_t)local_4c8,__stream);
        if (local_4c8 != pvVar8) {
          pcVar2 = bb->basename;
          uVar1 = ptr->fileid;
          lVar3 = ptr->roffset;
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          _big_file_raise("Failed to read in block `%s\' at (%d:%td) (%s)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x35d,pcVar2,(ulong)uVar1,lVar3 * iVar4,pcVar7);
          goto LAB_001060b0;
        }
        fclose(__stream);
        iVar5 = _dtype_convert((BigArrayIter *)&fp,(BigArrayIter *)&array_iter.dataptr,
                               (long)local_4c8 * (long)bb->nmemb);
        if (iVar5 != 0) {
          _big_file_raise((char *)0x0,
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x363);
          goto LAB_001060c4;
        }
        abs = abs - (long)local_4c8;
        iVar5 = big_block_seek_rel(bb,ptr,(ptrdiff_t)local_4c8);
      } while (iVar5 == 0);
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x368);
    }
LAB_001060c4:
    free(buf);
  }
  return -1;
}

Assistant:

int
big_block_read(BigBlock * bb, BigBlockPtr * ptr, BigArray * array)
{
    char * chunkbuf = malloc(CHUNK_BYTES);

    int nmemb = bb->nmemb ? bb->nmemb : 1;
    int felsize = big_file_dtype_itemsize(bb->dtype) * nmemb;
    size_t CHUNK_SIZE = CHUNK_BYTES / felsize;

    BigArray chunk_array = {0};
    size_t dims[2];
    dims[0] = CHUNK_SIZE;
    dims[1] = bb->nmemb;

    BigArrayIter chunk_iter;
    BigArrayIter array_iter;

    FILE * fp = NULL;
    ptrdiff_t toread = 0;

    RAISEIF(chunkbuf == NULL,
            ex_malloc,
            "Not enough memory for chunkbuf");

    big_array_init(&chunk_array, chunkbuf, bb->dtype, 2, dims, NULL);
    big_array_iter_init(&array_iter, array);

    toread = array->size / nmemb;

    ptrdiff_t abs = bb->foffset[ptr->fileid] + ptr->roffset + toread;
    RAISEIF(abs > bb->size,
                ex_eof,
                "Reading beyond the block `%s` at (%d:%td)",
                bb->basename, ptr->fileid, ptr->roffset * felsize);

    while(toread > 0 && ! big_block_eof(bb, ptr)) {
        size_t chunk_size = CHUNK_SIZE;
        /* remaining items in the file */
        if(chunk_size > bb->fsize[ptr->fileid] - ptr->roffset) {
            chunk_size = bb->fsize[ptr->fileid] - ptr->roffset;
        }
        /* remaining items to read */
        if(chunk_size > toread) {
            chunk_size = toread;
        }
        RAISEIF(chunk_size == 0,
            ex_insuf,
            "Insufficient number of items in file `%s' at (%d:%td)",
            bb->basename, ptr->fileid, ptr->roffset * felsize);

        /* read to the beginning of chunk */
        big_array_iter_init(&chunk_iter, &chunk_array);

        fp = _big_file_open_a_file(bb->basename, ptr->fileid, "r", 1);
        RAISEIF(fp == NULL,
                ex_open,
                NULL);
        RAISEIF(0 > fseek(fp, ptr->roffset * felsize, SEEK_SET),
                ex_seek,
                "Failed to seek in block `%s' at (%d:%td) (%s)", 
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        RAISEIF(chunk_size != fread(chunkbuf, felsize, chunk_size, fp),
                ex_read,
                "Failed to read in block `%s' at (%d:%td) (%s)",
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        fclose(fp);
        fp = NULL;

        /* now translate the data from chunkbuf to mptr */
        RAISEIF(0 != _dtype_convert(&array_iter, &chunk_iter, chunk_size * bb->nmemb),
            ex_convert, NULL);

        toread -= chunk_size;
        RAISEIF(0 != big_block_seek_rel(bb, ptr, chunk_size),
                ex_blockseek,
                NULL);
    }

    free(chunkbuf);
    return 0;
ex_read:
ex_seek:
    fclose(fp);
ex_insuf:
ex_convert:
ex_blockseek:
ex_open:
ex_eof:
    free(chunkbuf);
ex_malloc:
    return -1;
}